

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

void __thiscall
UnicodeFullTest_starts_with_Test<std::pair<char32_t,_char16_t>_>::TestBody
          (UnicodeFullTest_starts_with_Test<std::pair<char32_t,_char16_t>_> *this)

{
  bool bVar1;
  char32_t (*in_RDX) [5];
  char32_t (*in_string) [5];
  char32_t (*in_string_00) [5];
  char32_t (*in_string_01) [5];
  char32_t (*in_string_02) [5];
  char32_t (*in_string_03) [5];
  char32_t (*in_string_04) [5];
  char32_t (*in_string_05) [5];
  char32_t (*in_string_06) [5];
  char32_t (*in_string_07) [5];
  char32_t (*in_string_08) [5];
  char32_t (*in_string_09) [7];
  char32_t (*in_string_10) [5];
  char32_t (*in_string_11) [7];
  char32_t (*in_string_12) [5];
  char32_t (*in_string_13) [7];
  char32_t (*in_string_14) [5];
  char32_t (*in_string_15) [7];
  char32_t (*in_string_16) [5];
  char32_t (*in_string_17) [7];
  char32_t (*in_string_18) [7];
  char32_t (*in_string_19) [5];
  char32_t (*in_string_20) [7];
  char32_t (*in_string_21) [5];
  char32_t (*in_string_22) [7];
  char32_t (*in_string_23) [5];
  char32_t (*in_string_24) [7];
  char32_t (*in_string_25) [5];
  char32_t (*in_string_26) [7];
  char32_t (*in_string_27) [5];
  AssertHelper aAStack_68 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_60;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  AssertionResult gtest_ar_;
  
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_RDX);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_string);
  gtest_ar_.success_ = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd0,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_00);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",in_string_01);
  gtest_ar_.success_ = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd2,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_02);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",in_string_03);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd4,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_04);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_string_05);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd6,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABcd",in_string_06);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abCD",in_string_07);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xd8,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_08);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_60,(jessilib *)L"ABCDzz",in_string_09);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xdc,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_10);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_60,(jessilib *)L"abcdzz",in_string_11);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xde,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_string_12);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_60,(jessilib *)L"abcdzz",in_string_13);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe0,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",in_string_14);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_60,(jessilib *)L"ABCDzz",in_string_15);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe2,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[5]>(&local_40,(jessilib *)L"ABcd",in_string_16);
  jessilib::string_cast<char16_t,char32_t[7]>(&local_60,(jessilib *)L"abCDzz",in_string_17);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe4,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",in_string_18);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_string_19);
  gtest_ar_.success_ = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xe8,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",in_string_20);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",in_string_21);
  gtest_ar_.success_ = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xea,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",in_string_22);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abcd",in_string_23);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xec,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",in_string_24);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"ABCD",in_string_25);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xee,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  jessilib::string_cast<char32_t,char32_t[7]>(&local_40,(jessilib *)L"ABcdzz",in_string_26);
  jessilib::string_cast<char16_t,char32_t[5]>(&local_60,(jessilib *)L"abCD",in_string_27);
  bVar1 = jessilib::starts_with<char32_t,char16_t>(&local_40,&local_60);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u16string::~u16string((u16string *)&local_60);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  if (bVar1) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,&gtest_ar_.success_,
               "starts_with(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xf0,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(aAStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_68);
    std::__cxx11::string::~string((string *)&local_40);
    if (local_60._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_with) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_FALSE(starts_with(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));
}